

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase368::run(TestCase368 *this)

{
  SourceLocation location;
  bool bVar1;
  int iVar2;
  PromiseFulfiller<void> *pPVar3;
  undefined8 in_stack_fffffffffffffeb0;
  SourceLocation local_108;
  bool local_f0;
  bool local_ef;
  DebugExpression<bool> local_ee;
  undefined1 local_ed;
  bool local_ec;
  bool local_eb;
  DebugExpression<bool> local_ea [2];
  bool _kj_shouldLog_1;
  DebugExpression<bool> _kjCondition_1;
  bool _kj_shouldLog;
  DebugExpression<bool> _kjCondition;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined1 local_d0 [8];
  PromiseFulfillerPair<void> pair;
  undefined1 local_a8 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase368 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
  WaitScope::WaitScope((WaitScope *)local_a8,(EventLoop *)&waitScope.runningStacksPool);
  SourceLocation::SourceLocation
            ((SourceLocation *)&_kj_shouldLog_1,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x174,0xf);
  location.function = (char *)local_d8;
  location.fileName = pcStack_e0;
  location.lineNumber = (int)in_stack_fffffffffffffeb0;
  location.columnNumber = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  newPromiseAndFulfiller<void>(location);
  pPVar3 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->
                     ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&pair);
  iVar2 = (*(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[1])();
  local_eb = (bool)((byte)iVar2 & 1);
  local_ea[0] = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_eb);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)local_ea);
  if (!bVar1) {
    local_ec = kj::_::Debug::shouldLog(ERROR);
    while (local_ec != false) {
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x176,ERROR,"\"failed: expected \" \"pair.fulfiller->isWaiting()\", _kjCondition",
                 (char (*) [45])"failed: expected pair.fulfiller->isWaiting()",local_ea);
      local_ec = false;
    }
  }
  pPVar3 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->
                     ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&pair);
  (*(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar3,&local_ed);
  pPVar3 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->
                     ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&pair);
  iVar2 = (*(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[1])();
  local_ef = (bool)(~(byte)iVar2 & 1);
  local_ee = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_ef);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_ee);
  if (!bVar1) {
    local_f0 = kj::_::Debug::shouldLog(ERROR);
    while (local_f0 != false) {
      kj::_::Debug::log<char_const(&)[48],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x178,ERROR,
                 "\"failed: expected \" \"!(pair.fulfiller->isWaiting())\", _kjCondition",
                 (char (*) [48])"failed: expected !(pair.fulfiller->isWaiting())",&local_ee);
      local_f0 = false;
    }
  }
  SourceLocation::SourceLocation
            (&local_108,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x17a,3);
  Promise<void>::wait((Promise<void> *)local_d0,local_a8);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_d0);
  WaitScope::~WaitScope((WaitScope *)local_a8);
  EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
  return;
}

Assistant:

TEST(Async, SeparateFulfillerVoid) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto pair = newPromiseAndFulfiller<void>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.fulfiller->fulfill();
  EXPECT_FALSE(pair.fulfiller->isWaiting());

  pair.promise.wait(waitScope);
}